

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1dca6::
ARTScanTest_scanReverseThreeLeaves_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanReverseThreeLeaves_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *this_00;
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long uVar4;
  value_view v;
  value_view v_00;
  value_view v_01;
  key_view kVar5;
  undefined1 local_2d8 [8];
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  local_2d0 [4];
  byte *local_180;
  ulong local_178;
  undefined1 local_168 [8];
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  Message local_60;
  unsigned_long local_58;
  uint64_t n;
  uint64_t expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  uint64_t key;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_168,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_168,1,v,false);
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_168,2,v_00,false);
  v_01._M_extent._M_extent_value = 3;
  v_01._M_ptr = (pointer)&unodb::test::test_value_3;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_168,3,v_01,false);
  local_58 = 0;
  n = 3;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&verifier.test_db.db_.key_prefix_splits);
  if (iVar2 == 0) {
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    iterator((iterator *)local_2d8,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::last
              ((iterator *)local_2d8);
    uVar4 = 1;
    this_00 = &verifier.key_views.
               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while (local_2d0[0]._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_2d0[0]._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_58 = uVar4;
      kVar5 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_2d8);
      uVar1 = *(undefined8 *)kVar5._M_ptr;
      local_38.data_ =
           (AssertHelperData *)
           ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
            (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
            (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
           uVar1 << 0x38);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&expected,"(expected)","(key)",&n,(unsigned_long *)&local_38);
      if ((char)expected == '\0') {
        testing::Message::Message(&local_60);
        pcVar3 = "";
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
                   ,0x2e0,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,&local_60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if (local_60.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_60.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      n = n - 1;
      uVar4 = uVar4 + 1;
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
                ((iterator *)local_2d8);
    }
    if (0x100 < local_178) {
      free(local_180);
    }
    std::
    _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::~_Deque_base(local_2d0);
    pthread_mutex_unlock((pthread_mutex_t *)&verifier.test_db.db_.key_prefix_splits);
    expected._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_2d8,"(3)","(n)",(int *)&expected,&local_58);
    if (local_2d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&expected);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2d0[0]._M_impl.super__Deque_impl_data._M_map ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((_Alloc_hider *)local_2d0[0]._M_impl.super__Deque_impl_data._M_map)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
                 ,0x2e5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&expected);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((long *)CONCAT44(expected._4_4_,(undefined4)expected) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(expected._4_4_,(undefined4)expected) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_2d0[0]._M_impl.super__Deque_impl_data._M_map !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d0[0]._M_impl.super__Deque_impl_data._M_map);
    }
    if (verifier._224_8_ != 0) {
      operator_delete((void *)verifier._224_8_,
                      (long)verifier.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - verifier._224_8_);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~db
              ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanReverseThreeLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(2, unodb::test::test_values[1]);
  verifier.insert(3, unodb::test::test_values[2]);
  uint64_t n = 0;
  uint64_t expected = 3;
  const auto fn = [&n, &expected](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    const auto key = decode(v.get_key());
    UNODB_EXPECT_EQ(expected, key);
    expected--;
    return false;
  };
  db.scan(fn, false /*fwd*/);
  UNODB_EXPECT_EQ(3, n);
}